

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

ConstraintDeclarationSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ConstraintDeclarationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::syntax::TokenList_const&,slang::parsing::Token&,slang::syntax::NameSyntax&,slang::syntax::ConstraintBlockSyntax&>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          TokenList *args_1,Token *args_2,NameSyntax *args_3,ConstraintBlockSyntax *args_4)

{
  Token keyword;
  ConstraintDeclarationSyntax *this_00;
  
  this_00 = (ConstraintDeclarationSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ConstraintDeclarationSyntax *)this->endPtr < this_00 + 1) {
    this_00 = (ConstraintDeclarationSyntax *)allocateSlow(this,0x90,8);
  }
  else {
    this->head->current = (byte *)(this_00 + 1);
  }
  keyword.kind = args_2->kind;
  keyword._2_1_ = args_2->field_0x2;
  keyword.numFlags.raw = (args_2->numFlags).raw;
  keyword.rawLen = args_2->rawLen;
  keyword.info = args_2->info;
  slang::syntax::ConstraintDeclarationSyntax::ConstraintDeclarationSyntax
            (this_00,args,args_1,keyword,args_3,args_4);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }